

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O3

void findTextureWidgetsRecursively
               (QWidget *tlw,QWidget *widget,QPlatformTextureList *widgetTextures,
               QList<QWidget_*> *nativeChildren)

{
  QWidgetPrivate *this;
  QWidgetData *pQVar1;
  QPoint widget_00;
  bool bVar2;
  undefined4 uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  QRect local_58;
  QPoint local_48;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this = *(QWidgetPrivate **)&widget->field_0x8;
  if ((this->field_0x253 & 1) != 0) {
    uVar3 = (**(code **)(*(long *)this + 0x50))(this);
    auVar5._8_8_ = 0;
    auVar5._0_4_ = local_58.x2.m_i;
    auVar5._4_4_ = local_58.y2.m_i;
    local_58 = (QRect)(auVar5 << 0x40);
    local_48 = QWidget::mapTo(widget,tlw,(QPoint *)&local_58);
    pQVar1 = widget->data;
    local_40 = ((pQVar1->crect).x2.m_i + local_48.xp.m_i.m_i) - (pQVar1->crect).x1.m_i;
    local_3c = ((pQVar1->crect).y2.m_i + local_48.yp.m_i.m_i) - (pQVar1->crect).y1.m_i;
    auVar5 = (**(code **)(*(long *)this + 0x48))(this);
    local_58 = QWidgetPrivate::clipRect(this);
    QPlatformTextureList::appendTexture
              (widgetTextures,widget,auVar5._0_8_,auVar5._8_8_,&local_48,&local_58,uVar3);
  }
  if (*(long *)&this->field_0x28 != 0) {
    uVar4 = 0;
    do {
      widget_00 = *(QPoint *)(*(long *)&this->field_0x20 + uVar4 * 8);
      if ((widget_00 != (QPoint)0x0) &&
         ((*(byte *)(*(long *)((long)widget_00 + 8) + 0x30) & 1) != 0)) {
        if ((((*(QWidgetData **)((long)widget_00 + 0x20))->window_flags).
             super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i & 1)
            == 0) {
          bVar2 = hasPlatformWindow((QWidget *)widget_00);
          if (bVar2) {
            local_48 = widget_00;
            QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                      ((QPodArrayOps<QWidget*> *)nativeChildren,(nativeChildren->d).size,
                       (QWidget **)&local_48);
            QList<QWidget_*>::end(nativeChildren);
          }
        }
        if ((((*(QWidgetData **)((long)widget_00 + 0x20))->window_flags).
             super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i & 1)
            == 0) {
          bVar2 = hasPlatformWindow((QWidget *)widget_00);
          if (((!bVar2) &&
              (((*(QWidgetData **)((long)widget_00 + 0x20))->widget_attributes & 0x10000) == 0)) &&
             ((*(byte *)(*(long *)((long)widget_00 + 8) + 0x253) & 2) != 0)) {
            findTextureWidgetsRecursively(tlw,(QWidget *)widget_00,widgetTextures,nativeChildren);
          }
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < *(ulong *)&this->field_0x28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void findTextureWidgetsRecursively(QWidget *tlw, QWidget *widget,
                                          QPlatformTextureList *widgetTextures,
                                          QList<QWidget *> *nativeChildren)
{
    QWidgetPrivate *wd = QWidgetPrivate::get(widget);
    if (wd->renderToTexture) {
        QPlatformTextureList::Flags flags = wd->textureListFlags();
        const QRect rect(widget->mapTo(tlw, QPoint()), widget->size());
        QWidgetPrivate::TextureData data = wd->texture();
        widgetTextures->appendTexture(widget, data.textureLeft, data.textureRight, rect, wd->clipRect(), flags);
    }

    for (int i = 0; i < wd->children.size(); ++i) {
        QWidget *w = qobject_cast<QWidget *>(wd->children.at(i));
        // Stop at native widgets but store them. Stop at hidden widgets too.
        if (w && !w->isWindow() && hasPlatformWindow(w))
            nativeChildren->append(w);
        if (w && !w->isWindow() && !hasPlatformWindow(w) && !w->isHidden() && QWidgetPrivate::get(w)->textureChildSeen)
            findTextureWidgetsRecursively(tlw, w, widgetTextures, nativeChildren);
    }
}